

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O0

void __thiscall
Eigen::TriangularBase<Eigen::SelfAdjointView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u>>::
evalToLazy<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (TriangularBase<Eigen::SelfAdjointView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>> *this
          ,MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other)

{
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  Index rows;
  Index cols;
  Matrix<double,__1,__1,_0,__1,__1> *dst;
  SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U> *this_01;
  MatrixTypeNestedCleaned *src;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other_local;
  TriangularBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
  *this_local;
  
  this_00 = &EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                       ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  rows = TriangularBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>
         ::rows((TriangularBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                 *)this);
  cols = TriangularBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>
         ::cols((TriangularBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                 *)this);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(this_00,rows,cols);
  dst = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                  ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other);
  this_01 = TriangularBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>
            ::derived((TriangularBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                       *)this);
  src = SelfAdjointView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>::nestedExpression
                  (this_01);
  internal::
  call_triangular_assignment_loop<17,false,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (dst,src);
  return;
}

Assistant:

void TriangularBase<Derived>::evalToLazy(MatrixBase<DenseDerived> &other) const
{
  other.derived().resize(this->rows(), this->cols());
  internal::call_triangular_assignment_loop<Derived::Mode,(Derived::Mode&SelfAdjoint)==0 /* SetOpposite */>(other.derived(), derived().nestedExpression());
}